

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

int katherine_output_block_config_update(katherine_device_t *device)

{
  int iVar1;
  char val0;
  
  iVar1 = katherine_udp_mutex_lock(&device->control_socket);
  if (iVar1 == 0) {
    iVar1 = katherine_cmd60(&device->control_socket,'\x0e',val0);
    if (iVar1 == 0) {
      iVar1 = katherine_cmd_wait_ack(&device->control_socket);
    }
  }
  katherine_udp_mutex_unlock(&device->control_socket);
  return iVar1;
}

Assistant:

int
katherine_output_block_config_update(katherine_device_t *device)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    res = katherine_cmd_hw_output_block_config_update(&device->control_socket);
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}